

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O0

Twist * __thiscall iDynTree::SpatialInertia::applyInverse(SpatialInertia *this,SpatialMomentum *mom)

{
  SpatialVector<iDynTree::SpatialMotionVector> *in_RDI;
  Matrix<double,_6,_1,_0,_6,_1> velEigen;
  Matrix6x6 I;
  Matrix<double,_6,_1,_0,_6,_1> momEigen;
  Twist *vel;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false>_>
  *in_stack_fffffffffffffb88;
  SpatialVector<iDynTree::SpatialMotionVector> *b;
  SolverBase<Eigen::HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_> *this_00;
  MatrixFixSize<6U,_6U> *mat;
  SpatialVector<iDynTree::SpatialForceVector> *in_stack_fffffffffffffbd0;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffcb8;
  SpatialInertia *in_stack_fffffffffffffdb0;
  SolverBase<Eigen::HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_> local_88 [48];
  
  b = in_RDI;
  Twist::Twist((Twist *)0x6f456e);
  this_00 = local_88;
  SpatialVector<iDynTree::SpatialForceVector>::asVector(in_stack_fffffffffffffbd0);
  mat = (MatrixFixSize<6U,_6U> *)&stack0xffffffffffffffa8;
  toEigen<6U>((VectorFixSize<6U> *)mat);
  Eigen::Matrix<double,6,1,0,6,1>::
  Matrix<Eigen::Map<Eigen::Matrix<double,6,1,0,6,1>const,0,Eigen::Stride<0,0>>>
            ((Matrix<double,_6,_1,_0,_6,_1> *)in_RDI,
             (EigenBase<Eigen::Map<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffffb88);
  asMatrix(in_stack_fffffffffffffdb0);
  toEigen<6u,6u>(mat);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>::
  householderQr(in_stack_fffffffffffffcb8);
  Eigen::SolverBase<Eigen::HouseholderQR<Eigen::Matrix<double,6,6,1,6,6>>>::
  solve<Eigen::Matrix<double,6,1,0,6,1>>
            (this_00,(MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)b);
  Eigen::Matrix<double,6,1,0,6,1>::
  Matrix<Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,6,6,1,6,6>>,Eigen::Matrix<double,6,1,0,6,1>>>
            ((Matrix<double,_6,_1,_0,_6,_1> *)in_RDI,
             (EigenBase<Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
              *)in_stack_fffffffffffffb88);
  Eigen::HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::~HouseholderQR
            ((HouseholderQR<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)0x6f4658);
  Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)this_00,(Index)b,(Index)in_RDI);
  SpatialVector<iDynTree::SpatialMotionVector>::getLinearVec3(in_RDI);
  toEigen<3U>((VectorFixSize<3U> *)mat);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)in_RDI,
             in_stack_fffffffffffffb88);
  Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)this_00,(Index)b,(Index)in_RDI);
  SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3(in_RDI);
  toEigen<3U>((VectorFixSize<3U> *)mat);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)in_RDI,
             in_stack_fffffffffffffb88);
  return (Twist *)b;
}

Assistant:

Twist SpatialInertia::applyInverse(const SpatialMomentum& mom) const
{
    Twist vel;

    Eigen::Matrix<double,6,1> momEigen = toEigen(mom.asVector());

    Matrix6x6 I = this->asMatrix();
    Eigen::Matrix<double,6,1> velEigen = toEigen(I).householderQr().solve(momEigen);

    toEigen(vel.getLinearVec3()) = velEigen.block<3,1>(0,0);
    toEigen(vel.getAngularVec3()) = velEigen.block<3,1>(3,0);

    return vel;
}